

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InstrumentPass::InstProcessEntryPointCallTree
          (InstrumentPass *this,InstProcessFunction *pfn)

{
  Module *pMVar1;
  bool bVar2;
  ExecutionModel stage_idx;
  uint32_t uVar3;
  Instruction *pIVar4;
  uint uVar5;
  Instruction *e;
  Instruction *this_00;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  spv_position_t local_a8;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  
  stage_idx = Vertex;
  if (this->use_stage_info_ == true) {
    stage_idx = IRContext::GetStage((this->super_Pass).context_);
    uVar5 = stage_idx - RayGenerationKHR;
    if ((((0x34 < uVar5) || ((0x1800000000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
        (GLCompute < stage_idx)) &&
       ((1 < stage_idx - TaskNV &&
        ((this->super_Pass).consumer_.super__Function_base._M_manager != (_Manager_type)0x0)))) {
      local_88._M_impl.super__Deque_impl_data._M_map =
           &local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Stage not supported by instrumentation","");
      local_a8.line = 0;
      local_a8.column = 0;
      local_a8.index = 0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&(this->super_Pass).consumer_,SPV_MSG_ERROR,(char *)0x0,&local_a8,
                   (char *)local_88._M_impl.super__Deque_impl_data._M_map);
      if ((iterator *)local_88._M_impl.super__Deque_impl_data._M_map !=
          &local_88._M_impl.super__Deque_impl_data._M_start) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_map,
                        (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1);
      }
    }
    if (((0x34 < uVar5) || ((0x1800000000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
       ((GLCompute < stage_idx && (1 < stage_idx - TaskNV)))) {
      return false;
    }
  }
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_88,0);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_00 = *(Instruction **)
             ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar4 = (Instruction *)
           ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (this_00 != pIVar4) {
    do {
      uVar5 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar5 = (uint)this_00->has_result_id_;
      }
      uVar3 = Instruction::GetSingleWordOperand(this_00,uVar5 + 1);
      local_a8.line = CONCAT44(local_a8.line._4_4_,uVar3);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,(uint *)&local_a8);
      this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_00 != pIVar4);
  }
  bVar2 = InstProcessCallTreeFromRoots
                    (this,pfn,(queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&local_88,stage_idx);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
  return bVar2;
}

Assistant:

bool InstrumentPass::InstProcessEntryPointCallTree(InstProcessFunction& pfn) {
  uint32_t stage_id;
  if (use_stage_info_) {
    // Make sure all entry points have the same execution model. Do not
    // instrument if they do not.
    // TODO(greg-lunarg): Handle mixed stages. Technically, a shader module
    // can contain entry points with different execution models, although
    // such modules will likely be rare as GLSL and HLSL are geared toward
    // one model per module. In such cases we will need
    // to clone any functions which are in the call trees of entrypoints
    // with differing execution models.
    spv::ExecutionModel stage = context()->GetStage();
    // Check for supported stages
    if (stage != spv::ExecutionModel::Vertex &&
        stage != spv::ExecutionModel::Fragment &&
        stage != spv::ExecutionModel::Geometry &&
        stage != spv::ExecutionModel::GLCompute &&
        stage != spv::ExecutionModel::TessellationControl &&
        stage != spv::ExecutionModel::TessellationEvaluation &&
        stage != spv::ExecutionModel::TaskNV &&
        stage != spv::ExecutionModel::MeshNV &&
        stage != spv::ExecutionModel::RayGenerationNV &&
        stage != spv::ExecutionModel::IntersectionNV &&
        stage != spv::ExecutionModel::AnyHitNV &&
        stage != spv::ExecutionModel::ClosestHitNV &&
        stage != spv::ExecutionModel::MissNV &&
        stage != spv::ExecutionModel::CallableNV &&
        stage != spv::ExecutionModel::TaskEXT &&
        stage != spv::ExecutionModel::MeshEXT) {
      if (consumer()) {
        std::string message = "Stage not supported by instrumentation";
        consumer()(SPV_MSG_ERROR, 0, {0, 0, 0}, message.c_str());
      }
      return false;
    }
    stage_id = static_cast<uint32_t>(stage);
  } else {
    stage_id = 0;
  }
  // Add together the roots of all entry points
  std::queue<uint32_t> roots;
  for (auto& e : get_module()->entry_points()) {
    roots.push(e.GetSingleWordInOperand(kEntryPointFunctionIdInIdx));
  }
  bool modified = InstProcessCallTreeFromRoots(pfn, &roots, stage_id);
  return modified;
}